

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers_impl.h
# Opt level: O0

bool __thiscall
basisu::elemental_vector::increase_capacity
          (elemental_vector *this,uint32_t min_new_capacity,bool grow_hint,uint32_t element_size,
          object_mover pMover,bool nofail)

{
  bool bVar1;
  uint in_ECX;
  byte in_DL;
  uint in_ESI;
  long *in_RDI;
  code *in_R8;
  byte in_R9B;
  char buf_1 [256];
  void *new_p_1;
  char buf [256];
  void *new_p;
  size_t actual_size;
  size_t desired_size;
  size_t new_capacity;
  char local_268 [264];
  void *local_160;
  char local_158 [264];
  void *local_50;
  ulong local_48;
  ulong local_40;
  uint64_t local_38;
  byte local_29;
  code *local_28;
  uint local_1c;
  byte local_15;
  uint local_14;
  
  local_15 = in_DL & 1;
  local_29 = in_R9B & 1;
  if (*(uint *)((long)in_RDI + 0xc) < *(uint *)(in_RDI + 1)) {
    __assert_fail("m_size <= m_capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers_impl.h"
                  ,0xc,
                  "bool basisu::elemental_vector::increase_capacity(uint32_t, bool, uint32_t, object_mover, bool)"
                 );
  }
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x400000000)) / ZEXT416(in_ECX),0) <= (ulong)in_ESI) {
    __assert_fail("min_new_capacity < (0x400000000ULL / element_size)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers_impl.h"
                  ,0xf,
                  "bool basisu::elemental_vector::increase_capacity(uint32_t, bool, uint32_t, object_mover, bool)"
                 );
  }
  if (*(uint *)((long)in_RDI + 0xc) < in_ESI) {
    local_38 = (uint64_t)in_ESI;
    local_28 = in_R8;
    local_1c = in_ECX;
    if ((local_15 != 0) && (local_14 = in_ESI, bVar1 = helpers::is_power_of_2(local_38), !bVar1)) {
      local_38 = helpers::next_pow2(local_38);
      bVar1 = false;
      if (local_38 != 0) {
        bVar1 = *(uint *)((long)in_RDI + 0xc) < local_38;
      }
      if (!bVar1) {
        __assert_fail("new_capacity && (new_capacity > m_capacity)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers_impl.h"
                      ,0x1b,
                      "bool basisu::elemental_vector::increase_capacity(uint32_t, bool, uint32_t, object_mover, bool)"
                     );
      }
      if (local_38 < local_14) {
        if ((local_29 & 1) == 0) {
          fprintf(_stderr,"vector too large\n");
          abort();
        }
        return false;
      }
    }
    local_40 = local_1c * local_38;
    local_48 = 0;
    if (local_28 == (code *)0x0) {
      local_50 = realloc((void *)*in_RDI,local_40);
      if (local_50 == (void *)0x0) {
        if ((local_29 & 1) == 0) {
          snprintf(local_158,0x100,"vector: realloc() failed allocating %u bytes",
                   local_40 & 0xffffffff);
          fprintf(_stderr,"%s",local_158);
          abort();
        }
        return false;
      }
      local_48 = local_40;
      *in_RDI = (long)local_50;
    }
    else {
      local_160 = malloc(local_40);
      if (local_160 == (void *)0x0) {
        if ((local_29 & 1) == 0) {
          snprintf(local_268,0x100,"vector: malloc() failed allocating %u bytes",
                   local_40 & 0xffffffff);
          fprintf(_stderr,"%s",local_268);
          abort();
        }
        return false;
      }
      local_48 = local_40;
      (*local_28)(local_160,*in_RDI,(int)in_RDI[1]);
      if (*in_RDI != 0) {
        free((void *)*in_RDI);
      }
      *in_RDI = (long)local_160;
    }
    if (local_40 < local_48) {
      *(int *)((long)in_RDI + 0xc) = (int)(local_48 / local_1c);
    }
    else {
      *(int *)((long)in_RDI + 0xc) = (int)local_38;
    }
  }
  return true;
}

Assistant:

bool elemental_vector::increase_capacity(uint32_t min_new_capacity, bool grow_hint, uint32_t element_size, object_mover pMover, bool nofail)
   {
      assert(m_size <= m_capacity);

      if (sizeof(void *) == sizeof(uint64_t))
         assert(min_new_capacity < (0x400000000ULL / element_size));
      else
         assert(min_new_capacity < (0x7FFF0000U / element_size));

      if (m_capacity >= min_new_capacity)
         return true;

      size_t new_capacity = min_new_capacity;
      if ((grow_hint) && (!helpers::is_power_of_2((uint64_t)new_capacity)))
      {
         new_capacity = (size_t)helpers::next_pow2((uint64_t)new_capacity);

         assert(new_capacity && (new_capacity > m_capacity));

         if (new_capacity < min_new_capacity)
         {
            if (nofail)
               return false;
            fprintf(stderr, "vector too large\n");
            abort();
         }
      }
            
      const size_t desired_size = element_size * new_capacity;
      size_t actual_size = 0;
      if (!pMover)
      {
         void* new_p = realloc(m_p, desired_size);
         if (!new_p)
         {
            if (nofail)
               return false;

            char buf[256];
#ifdef _MSC_VER
            sprintf_s(buf, sizeof(buf), "vector: realloc() failed allocating %u bytes", (uint32_t)desired_size);
#else
            snprintf(buf, sizeof(buf), "vector: realloc() failed allocating %u bytes", (uint32_t)desired_size);
#endif
            fprintf(stderr, "%s", buf);
            abort();
         }

#if BASISU_VECTOR_DETERMINISTIC
         actual_size = desired_size;
#elif defined(_MSC_VER)
         actual_size = _msize(new_p);
#elif HAS_MALLOC_USABLE_SIZE
         actual_size = malloc_usable_size(new_p);
#else
         actual_size = desired_size;
#endif
         m_p = new_p;
      }
      else
      {
         void* new_p = malloc(desired_size);
         if (!new_p)
         {
            if (nofail)
               return false;

            char buf[256];
#ifdef _MSC_VER
            sprintf_s(buf, sizeof(buf), "vector: malloc() failed allocating %u bytes", (uint32_t)desired_size);
#else
            snprintf(buf, sizeof(buf), "vector: malloc() failed allocating %u bytes", (uint32_t)desired_size);
#endif
            fprintf(stderr, "%s", buf);
            abort();
         }

#if BASISU_VECTOR_DETERMINISTIC
         actual_size = desired_size;
#elif defined(_MSC_VER)
         actual_size = _msize(new_p);
#elif HAS_MALLOC_USABLE_SIZE
         actual_size = malloc_usable_size(new_p);
#else
         actual_size = desired_size;
#endif

         (*pMover)(new_p, m_p, m_size);

         if (m_p)
            free(m_p);
         
         m_p = new_p;
      }

      if (actual_size > desired_size)
         m_capacity = static_cast<uint32_t>(actual_size / element_size);
      else
         m_capacity = static_cast<uint32_t>(new_capacity);

      return true;
   }